

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall
Assembler::processLdStrMemDir(Assembler *this,string *instruction,int reg,string *operand)

{
  bool bVar1;
  string local_a0;
  string local_80;
  string local_50;
  int local_30;
  int local_2c;
  int value;
  int adr;
  string *operand_local;
  string *psStack_18;
  int reg_local;
  string *instruction_local;
  Assembler *this_local;
  
  local_2c = 4;
  _value = operand;
  operand_local._4_4_ = reg;
  psStack_18 = instruction;
  instruction_local = &this->inputFileName;
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (operand,&symbolReg_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_50,(string *)operand);
    local_30 = processAbsoluteAddressingSymbol(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)operand);
    local_30 = literalToDecimal(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::string((string *)&local_a0,(string *)instruction);
  instr5Bytes(this,&local_a0,operand_local._4_4_,local_2c,local_30);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void Assembler::processLdStrMemDir(string instruction, int reg, string operand) {
    int adr = 0x04;
    int value;

    if (regex_match(operand, symbolReg)) value = processAbsoluteAddressingSymbol(operand);
    else value = literalToDecimal(operand);

    instr5Bytes(instruction, reg, adr, value);
    return;
}